

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

triplet<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
           *this,triplet<unsigned_short> x,triplet<unsigned_short> ra,triplet<unsigned_short> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  unsigned_short uVar1;
  unsigned_short uVar2;
  int32_t error_value;
  int32_t error_value_00;
  int32_t error_value_01;
  triplet<unsigned_short> tVar3;
  uint predicted_value;
  uint predicted_value_00;
  uint uVar4;
  uint uVar5;
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> *this_00;
  uint predicted_value_01;
  uint uVar6;
  
  predicted_value_00 = rb._0_4_ >> 0x10;
  predicted_value_01 = (uint)rb.field_2.v3;
  this_00 = &this->traits_;
  predicted_value = rb._0_4_ & 0xffff;
  uVar5 = -(uint)(predicted_value < (ra._0_4_ & 0xffff)) | 1;
  error_value = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
                compute_error_value(this_00,((x._0_4_ & 0xffff) - predicted_value) * uVar5);
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  uVar4 = -(uint)(predicted_value_00 < ra._0_4_ >> 0x10) | 1;
  error_value_00 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::compute_error_value
                 (this_00,((x._0_4_ >> 0x10) - predicted_value_00) * uVar4);
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  uVar6 = -(uint)(predicted_value_01 < ra.field_2.v3) | 1;
  error_value_01 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::compute_error_value
                 (this_00,(x.field_2.v3 - predicted_value_01) * uVar6);
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  tVar3.field_0.v1 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
       compute_reconstructed_sample(this_00,predicted_value,uVar5 * error_value);
  uVar1 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,predicted_value_00,uVar4 * error_value_00);
  uVar2 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,predicted_value_01,uVar6 * error_value_01);
  tVar3.field_2.v3 = uVar2;
  tVar3.field_1.v2 = uVar1;
  return tVar3;
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }